

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

BuiltinFunction * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::BuiltinFunction,jsonnet::internal::LocationRange_const&,std::__cxx11::string,std::vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>&>
          (Allocator *this,LocationRange *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *args_2)

{
  BuiltinFunction *this_00;
  BuiltinFunction *local_30;
  
  this_00 = (BuiltinFunction *)operator_new(0xb8);
  BuiltinFunction::BuiltinFunction(this_00,args,args_1,args_2);
  local_30 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_30);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }